

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O3

cmCMakePath * __thiscall cmCMakePath::ReplaceWideExtension(cmCMakePath *this,string_view extension)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  path *ppVar9;
  string file;
  path local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar8 = extension._M_str;
  sVar2 = (this->Path)._M_pathname._M_string_length;
  if (sVar2 != 0) {
    _Var3._M_head_impl =
         (this->Path)._M_cmpts._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    uVar4 = (uint)_Var3._M_head_impl;
    ppVar9 = &this->Path;
    if (((ulong)_Var3._M_head_impl & 3) == 0) {
      if ((this->Path)._M_pathname._M_dataplus._M_p[sVar2 - 1] != '/') {
        if (((ulong)_Var3._M_head_impl & 3) == 0) {
          lVar6 = std::filesystem::__cxx11::path::_List::end();
          ppVar9 = (path *)(lVar6 + -0x30);
          if (((ulong)(this->Path)._M_cmpts._M_impl._M_t.
                      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                      _M_head_impl & 3) != 0) {
            ppVar9 = &this->Path;
          }
          uVar4 = (uint)(ppVar9->_M_cmpts)._M_impl._M_t.
                        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        .
                        super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                        ._M_head_impl;
        }
        if ((~uVar4 & 3) == 0) goto LAB_0042552f;
      }
    }
    else if ((uVar4 & 3) == 3) {
LAB_0042552f:
      std::filesystem::__cxx11::path::path(&local_70,ppVar9);
      goto LAB_0042557c;
    }
  }
  std::filesystem::__cxx11::path::path(&local_70);
LAB_0042557c:
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,local_70._M_pathname._M_dataplus._M_p,
             local_70._M_pathname._M_dataplus._M_p + local_70._M_pathname._M_string_length);
  std::filesystem::__cxx11::path::~path(&local_70);
  if ((((local_48._M_string_length != 0) &&
       (iVar5 = std::__cxx11::string::compare((char *)&local_48), iVar5 != 0)) &&
      (iVar5 = std::__cxx11::string::compare((char *)&local_48), iVar5 != 0)) &&
     (uVar7 = std::__cxx11::string::find((char)&local_48,0x2e), uVar7 != 0xffffffffffffffff)) {
    if (local_48._M_string_length < uVar7) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                 uVar7);
    }
    local_48._M_dataplus._M_p[uVar7] = '\0';
    local_48._M_string_length = uVar7;
  }
  if (extension._M_len != 0) {
    if (*pcVar8 != '.') {
      std::__cxx11::string::push_back((char)&local_48);
    }
    paVar1 = &local_70._M_pathname.field_2;
    local_70._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,pcVar8,pcVar8 + extension._M_len);
    std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_70._M_pathname._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_pathname._M_dataplus._M_p,
                      local_70._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_70,&local_48,auto_format);
  std::filesystem::__cxx11::path::replace_filename(&this->Path);
  std::filesystem::__cxx11::path::~path(&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

cmCMakePath& cmCMakePath::ReplaceWideExtension(cm::string_view extension)
{
  auto file = this->Path.filename().string();
  if (!file.empty() && file != "." && file != "..") {
    auto pos = file.find('.', file[0] == '.' ? 1 : 0);
    if (pos != std::string::npos) {
      file.erase(pos);
    }
  }
  if (!extension.empty()) {
    if (extension[0] != '.') {
      file += '.';
    }
    file.append(std::string(extension));
  }
  this->Path.replace_filename(file);
  return *this;
}